

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroSet
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  _Head_base<0UL,_CAssemblerCommand_*,_false> _Var1;
  undefined4 in_register_0000000c;
  byte bVar2;
  long lVar3;
  uint uVar4;
  char *pcVar5;
  uint in_R8D;
  uint uVar6;
  char *__s;
  initializer_list<AssemblyTemplateArgument> variables;
  allocator<char> local_1ac;
  allocator<char> local_1ab;
  allocator<char> local_1aa;
  allocator<char> local_1a9;
  MipsRegisterData *local_1a8;
  _Head_base<0UL,_CAssemblerCommand_*,_false> local_1a0;
  MipsImmediateData *local_198;
  string macroText;
  char *local_170;
  string local_168 [32];
  char *local_148;
  string local_140 [32];
  char *local_120;
  string local_118 [32];
  char *local_f8;
  string local_f0 [32];
  char *local_d0;
  string local_c8 [32];
  char *local_a8;
  string local_a0 [32];
  char *local_80;
  string local_78 [32];
  char *local_58;
  string local_50;
  
  local_198 = (MipsImmediateData *)CONCAT44(in_register_0000000c,flags);
  uVar6 = in_R8D & 7;
  uVar4 = in_R8D & 6;
  pcVar5 = 
  "\n\t\t\txor\t\t%rd%,%rs%,%rt%\n\t\t\t.if %eq%\n\t\t\t\tsltiu\t%rd%,%rd%,1\n\t\t\t.else\n\t\t\t\tsltu\t%rd%,r0,%rd%\n\t\t\t.endif\n\t\t"
  ;
  if ((in_R8D & 0x200) != 0) {
    pcVar5 = 
    "\n\t\t\t.if %imm% & ~0xFFFF\n\t\t\t\tli\t\t%rd%,%imm%\n\t\t\t\txor\t\t%rd%,%rs%,%rd%\n\t\t\t.else\n\t\t\t\txori\t%rd%,%rs%,%imm%\n\t\t\t.endif\n\t\t\t.if %eq%\n\t\t\t\tsltiu\t%rd%,%rd%,1\n\t\t\t.else\n\t\t\t\tsltu\t%rd%,r0,%rd%\n\t\t\t.endif\n\t\t"
    ;
  }
  if ((uVar6 != 1) && (uVar6 != 6)) {
    bVar2 = (uVar4 == 2 || uVar4 == 4) & (byte)(in_R8D >> 9);
    pcVar5 = 
    "\n\t\t\t.if %revcmp%\n\t\t\t\tslt%u%\t%rd%,%rt%,%rs%\n\t\t\t.else\n\t\t\t\tslt%u%\t%rd%,%rs%,%rt%\n\t\t\t.endif\n\t\t\txori\t%rd%,%rd%,1\n\t\t"
    ;
    if (bVar2 != 0) {
      pcVar5 = 
      "\n\t\t\t.if %revcmp% && %imm% == 0\n\t\t\t\tslt%u%\t%rd%,r0,%rs%\n\t\t\t.elseif %revcmp%\n\t\t\t\tli\t\t%rd%,%imm%\n\t\t\t\tslt%u%\t%rd%,%rd%,%rs%\n\t\t\t.elseif (%imm% < -0x8000) || (%imm% >= 0x8000)\n\t\t\t\tli\t\t%rd%,%imm%\n\t\t\t\tslt%u%\t%rd%,%rs%,%rd%\n\t\t\t.else\n\t\t\t\tslti%u%\t%rd%,%rs%,%imm%\n\t\t\t.endif\n\t\t\t.if %ge%\n\t\t\t\txori\t%rd%,%rd%,1\n\t\t\t.endif\n\t\t"
      ;
    }
    if (uVar4 != 4 && bVar2 == 0) {
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
             )(__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
               )parser;
    }
  }
  local_1a8 = registers;
  local_1a0._M_head_impl = (CAssemblerCommand *)parser;
  preprocessMacro_abi_cxx11_(&macroText,pcVar5,local_198);
  local_170 = "%u%";
  pcVar5 = " ";
  if ((uVar6 - 3 & 0xfffffffd) == 0) {
    pcVar5 = "u";
  }
  std::__cxx11::string::string<std::allocator<char>>(local_168,pcVar5,&local_1a9);
  local_148 = "%eq%";
  __s = "1";
  pcVar5 = "0";
  if (uVar6 == 6) {
    pcVar5 = "1";
  }
  std::__cxx11::string::string<std::allocator<char>>(local_140,pcVar5,&local_1aa);
  local_120 = "%ge%";
  pcVar5 = "0";
  if (uVar4 == 4) {
    pcVar5 = "1";
  }
  std::__cxx11::string::string<std::allocator<char>>(local_118,pcVar5,&local_1ab);
  local_f8 = "%revcmp%";
  if ((in_R8D >> 0x13 & 1) == 0) {
    __s = "0";
  }
  std::__cxx11::string::string<std::allocator<char>>(local_f0,__s,&local_1ac);
  local_d0 = "%rd%";
  std::__cxx11::string::string(local_c8,(string *)&immediates[1].primary.expression.constExpression)
  ;
  local_a8 = "%rs%";
  std::__cxx11::string::string(local_a0,(string *)&(immediates->primary).expression);
  local_80 = "%rt%";
  std::__cxx11::string::string
            (local_78,(string *)
                      &(immediates->secondary).expression.expression.
                       super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  local_58 = "%imm%";
  Expression::toString_abi_cxx11_(&local_50,&(local_198->secondary).expression);
  _Var1._M_head_impl = local_1a0._M_head_impl;
  variables._M_array = (iterator)(ulong)in_R8D;
  variables._M_len = (size_type)&local_170;
  createMacro((Parser *)local_1a0._M_head_impl,(string *)local_1a8,(int)&macroText,variables);
  lVar3 = 0x120;
  do {
    std::__cxx11::string::~string(local_168 + lVar3 + -8);
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&macroText);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         _Var1._M_head_impl;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroSet(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* selectedTemplate;

	int type = flags & MIPSM_CONDITIONMASK;

	bool ne = type == MIPSM_NE;
	bool eq = type == MIPSM_EQ;
	bool ge = type == MIPSM_GE || type == MIPSM_GEU;
	bool lt = type == MIPSM_LT || type == MIPSM_LTU;
	bool unsigned_ = type == MIPSM_GEU || type == MIPSM_LTU;
	bool immediate = (flags & MIPSM_IMM) != 0;
	bool revcmp = (flags & MIPSM_REVCMP) != 0;

	if (immediate && (ne || eq))
	{
		const char* templateImmediateEqNe = R"(
			.if %imm% & ~0xFFFF
				li		%rd%,%imm%
				xor		%rd%,%rs%,%rd%
			.else
				xori	%rd%,%rs%,%imm%
			.endif
			.if %eq%
				sltiu	%rd%,%rd%,1
			.else
				sltu	%rd%,r0,%rd%
			.endif
		)";

		selectedTemplate = templateImmediateEqNe;
	} else if (ne || eq)
	{
		const char* templateEqNe = R"(
			xor		%rd%,%rs%,%rt%
			.if %eq%
				sltiu	%rd%,%rd%,1
			.else
				sltu	%rd%,r0,%rd%
			.endif
		)";

		selectedTemplate = templateEqNe;
	} else if (immediate && (ge || lt))
	{
		const char* templateImmediateGeLt = R"(
			.if %revcmp% && %imm% == 0
				slt%u%	%rd%,r0,%rs%
			.elseif %revcmp%
				li		%rd%,%imm%
				slt%u%	%rd%,%rd%,%rs%
			.elseif (%imm% < -0x8000) || (%imm% >= 0x8000)
				li		%rd%,%imm%
				slt%u%	%rd%,%rs%,%rd%
			.else
				slti%u%	%rd%,%rs%,%imm%
			.endif
			.if %ge%
				xori	%rd%,%rd%,1
			.endif
		)";

		selectedTemplate = templateImmediateGeLt;
	} else if (ge)
	{
		const char* templateGe = R"(
			.if %revcmp%
				slt%u%	%rd%,%rt%,%rs%
			.else
				slt%u%	%rd%,%rs%,%rt%
			.endif
			xori	%rd%,%rd%,1
		)";

		selectedTemplate = templateGe;
	} else
	{
		return nullptr;
	}

	std::string macroText = preprocessMacro(selectedTemplate,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%u%",		unsigned_ ? "u" : " "},
			{ "%eq%",		eq ? "1" : "0" },
			{ "%ge%",		ge ? "1" : "0" },
			{ "%revcmp%",	revcmp ? "1" : "0" },
			{ "%rd%",		registers.grd.name.string() },
			{ "%rs%",		registers.grs.name.string() },
			{ "%rt%",		registers.grt.name.string() },
			{ "%imm%",		immediates.secondary.expression.toString() },
	});
}